

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O2

void * FileSystem::ReadFileRawToEnd(string *file)

{
  size_t __size;
  void *__ptr;
  FILE *__stream;
  size_t sVar1;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)file);
  __size = GetFileSize(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if ((__size != 0) && (__ptr = malloc(__size), __ptr != (void *)0x0)) {
    __stream = fopen((file->_M_dataplus)._M_p,"r");
    if (__stream != (FILE *)0x0) {
      sVar1 = fread(__ptr,1,__size,__stream);
      fclose(__stream);
      if (sVar1 == __size) {
        return __ptr;
      }
    }
    free(__ptr);
  }
  return (void *)0x0;
}

Assistant:

void* FileSystem::ReadFileRawToEnd(string file) {
    off_t fileSize = GetFileSize(file);

    if(fileSize == 0)
        return NULL;

    void* allocatedBuffer = malloc((size_t) fileSize);

    if(allocatedBuffer == NULL)
        return NULL;

    FILE* fp = fopen(file.c_str(), "r");

    if(fp) {
        size_t readSize = fread(allocatedBuffer, 1, (size_t) fileSize, fp);

        fclose(fp);

        if(readSize == fileSize) {
            return allocatedBuffer;
        }
    }

    free(allocatedBuffer);

    return NULL;
}